

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket.cpp
# Opt level: O0

bool __thiscall Client::Connect(Client *this,IPAddress *addr,uint16_t port)

{
  uint16_t uVar1;
  uint __hostlong;
  uint32_t uVar2;
  int iVar3;
  pointer piVar4;
  time_t tVar5;
  uint16_t port_local;
  IPAddress *addr_local;
  Client *this_local;
  
  piVar4 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                     (&this->impl);
  memset(&piVar4->sin,0,0x10);
  piVar4 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                     (&this->impl);
  (piVar4->sin).sin_family = 2;
  __hostlong = IPAddress::operator_cast_to_unsigned_int(addr);
  uVar2 = htonl(__hostlong);
  piVar4 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                     (&this->impl);
  (piVar4->sin).sin_addr.s_addr = uVar2;
  uVar1 = htons(port);
  piVar4 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                     (&this->impl);
  (piVar4->sin).sin_port = uVar1;
  piVar4 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                     (&this->impl);
  iVar3 = piVar4->sock;
  piVar4 = std::unique_ptr<Client::impl_,_std::default_delete<Client::impl_>_>::operator->
                     (&this->impl);
  iVar3 = connect(iVar3,(sockaddr *)&piVar4->sin,0x10);
  if (iVar3 == 0) {
    tVar5 = time((time_t *)0x0);
    this->connect_time = tVar5;
    this->connected = true;
  }
  else {
    this->connected = false;
  }
  return iVar3 == 0;
}

Assistant:

bool Client::Connect(const IPAddress &addr, uint16_t port)
{
	std::memset(&this->impl->sin, 0, sizeof(this->impl->sin));
	this->impl->sin.sin_family = AF_INET;
	this->impl->sin.sin_addr.s_addr = htonl(addr);
	this->impl->sin.sin_port = htons(port);

	if (connect(this->impl->sock, reinterpret_cast<sockaddr *>(&this->impl->sin), sizeof(this->impl->sin)) != 0)
	{
		return this->connected = false;
	}

	this->connect_time = std::time(0);

	return this->connected = true;
}